

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC4193(CNetAddr *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  
  if (this->m_net == NET_IPV6) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    bVar1 = ((this->m_addr)._union.direct[0] & 0xfeU) == 0xfc;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC4193() const
{
    return IsIPv6() && (m_addr[0] & 0xFE) == 0xFC;
}